

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraMan.c
# Opt level: O2

void Fra_ManFinalizeComb(Fra_Man_t *p)

{
  Vec_Ptr_t *p_00;
  void *pvVar1;
  ulong uVar2;
  Aig_Obj_t *pDriver;
  int i;
  
  i = 0;
  while( true ) {
    p_00 = p->pManAig->vCos;
    if (p_00->nSize <= i) {
      Aig_ManCleanMarkB(p->pManFraig);
      return;
    }
    pvVar1 = Vec_PtrEntry(p_00,i);
    if (((ulong)pvVar1 & 1) != 0) break;
    uVar2 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
    if (uVar2 == 0) {
      pDriver = (Aig_Obj_t *)0x0;
    }
    else {
      pDriver = (Aig_Obj_t *)
                ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^
                *(ulong *)(*(long *)(*(long *)(uVar2 + 0x28) + 0x20) +
                          (long)*(int *)(uVar2 + 0x24) *
                          (long)*(int *)(*(long *)(uVar2 + 0x28) + 0x18) * 8));
    }
    Aig_ObjCreateCo(p->pManFraig,pDriver);
    i = i + 1;
  }
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fra.h"
                ,0x110,"Aig_Obj_t *Fra_ObjChild0Fra(Aig_Obj_t *, int)");
}

Assistant:

void Fra_ManFinalizeComb( Fra_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    // add the POs
    Aig_ManForEachCo( p->pManAig, pObj, i )
        Aig_ObjCreateCo( p->pManFraig, Fra_ObjChild0Fra(pObj,0) );
    // postprocess
    Aig_ManCleanMarkB( p->pManFraig );
}